

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O3

void __thiscall cmCTestLaunchReporter::WriteXML(cmCTestLaunchReporter *this)

{
  bool bVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmXMLElement e2;
  string logXML;
  cmXMLWriter xml;
  cmGeneratedFileStream fxml;
  cmXMLElement local_300;
  string local_2f8;
  char *local_2d8;
  cmXMLWriter local_2d0;
  undefined1 local_278 [16];
  long local_268;
  char *local_260;
  size_type local_258;
  pointer local_250;
  undefined8 local_248;
  char *local_240;
  
  local_278._8_8_ = (this->LogDir)._M_dataplus._M_p;
  local_278._0_8_ = (this->LogDir)._M_string_length;
  bVar1 = this->ExitCode == 0;
  local_260 = "error-";
  if (bVar1) {
    local_260 = "warning-";
  }
  local_268 = (ulong)bVar1 * 2 + 6;
  local_250 = (this->LogHash)._M_dataplus._M_p;
  local_258 = (this->LogHash)._M_string_length;
  local_248 = 4;
  local_240 = ".xml";
  views._M_len = 4;
  views._M_array = (iterator)local_278;
  cmCatViews_abi_cxx11_(&local_2f8,views);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,&local_2f8,false,None);
  cmXMLWriter::cmXMLWriter(&local_2d0,(ostream *)local_278,2);
  cmXMLElement::cmXMLElement(&local_300,&local_2d0,"Failure");
  local_2d8 = "Error";
  if (this->ExitCode == 0) {
    local_2d8 = "Warning";
  }
  cmXMLWriter::Attribute<char_const*>(local_300.xmlwr,"type",&local_2d8);
  WriteXMLAction(this,&local_300);
  WriteXMLCommand(this,&local_300);
  WriteXMLResult(this,&local_300);
  WriteXMLLabels(this,&local_300);
  cmXMLWriter::EndElement(local_300.xmlwr);
  cmXMLWriter::~cmXMLWriter(&local_2d0);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestLaunchReporter::WriteXML()
{
  // Name the xml file.
  std::string logXML =
    cmStrCat(this->LogDir, this->IsError() ? "error-" : "warning-",
             this->LogHash, ".xml");

  // Use cmGeneratedFileStream to atomically create the report file.
  cmGeneratedFileStream fxml(logXML);
  cmXMLWriter xml(fxml, 2);
  cmXMLElement e2(xml, "Failure");
  e2.Attribute("type", this->IsError() ? "Error" : "Warning");
  this->WriteXMLAction(e2);
  this->WriteXMLCommand(e2);
  this->WriteXMLResult(e2);
  this->WriteXMLLabels(e2);
}